

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_reader_extract_file_to_callback
                  (mz_zip_archive *pZip,char *pFilename,mz_file_write_func pCallback,void *pOpaque,
                  mz_uint flags)

{
  int iVar1;
  int file_index;
  char *in_stack_00000030;
  mz_zip_archive *in_stack_00000038;
  mz_uint in_stack_00002dbc;
  void *in_stack_00002dc0;
  mz_file_write_func in_stack_00002dc8;
  mz_uint in_stack_00002dd4;
  mz_zip_archive *in_stack_00002dd8;
  undefined4 local_4;
  
  iVar1 = mz_zip_reader_locate_file
                    (in_stack_00000038,in_stack_00000030,(char *)pZip,pFilename._4_4_);
  if (iVar1 < 0) {
    local_4 = 0;
  }
  else {
    local_4 = mz_zip_reader_extract_to_callback
                        (in_stack_00002dd8,in_stack_00002dd4,in_stack_00002dc8,in_stack_00002dc0,
                         in_stack_00002dbc);
  }
  return local_4;
}

Assistant:

mz_bool mz_zip_reader_extract_file_to_callback(mz_zip_archive *pZip,
                                               const char *pFilename,
                                               mz_file_write_func pCallback,
                                               void *pOpaque, mz_uint flags) {
  int file_index = mz_zip_reader_locate_file(pZip, pFilename, NULL, flags);
  if (file_index < 0)
    return MZ_FALSE;
  return mz_zip_reader_extract_to_callback(pZip, file_index, pCallback, pOpaque,
                                           flags);
}